

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iremga20.c
# Opt level: O0

void irem_ga20_cache_samples(ga20_state *chip,IremGA20_channel_def *ch)

{
  IremGA20_channel_def *ch_local;
  ga20_state *chip_local;
  
  if (chip->rom[ch->pos] == '\0') {
    ch->play = '\0';
  }
  else {
    ch->smpl1 = chip->rom[ch->pos] + 0x80;
  }
  if (chip->rom[ch->pos + 1] != '\0') {
    ch->smpl2 = chip->rom[ch->pos + 1] + 0x80;
  }
  return;
}

Assistant:

INLINE void irem_ga20_cache_samples(ga20_state *chip, struct IremGA20_channel_def* ch)
{
	if (! chip->rom[ch->pos])	// check for sample end marker
		ch->play = 0;
	else
		ch->smpl1 = chip->rom[ch->pos] - 0x80;
	if (chip->rom[ch->pos + 1])
		ch->smpl2 = chip->rom[ch->pos + 1] - 0x80;
	
	return;
}